

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

_Bool al_join_paths(ALLEGRO_PATH *path,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  undefined8 *puVar2;
  char *s;
  ALLEGRO_USTR *pAVar3;
  ulong uVar4;
  uint uVar5;
  
  _Var1 = path_is_absolute(tail);
  if (!_Var1) {
    al_ustr_assign(path->filename,tail->filename);
    if ((tail->segments)._size != 0) {
      uVar5 = 1;
      do {
        puVar2 = (undefined8 *)_al_vector_ref(&tail->segments,uVar5 - 1);
        s = al_cstr((ALLEGRO_USTR *)*puVar2);
        puVar2 = (undefined8 *)_al_vector_alloc_back(&path->segments);
        pAVar3 = al_ustr_new(s);
        *puVar2 = pAVar3;
        uVar4 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar4 < (tail->segments)._size);
    }
  }
  return !_Var1;
}

Assistant:

bool al_join_paths(ALLEGRO_PATH *path, const ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(path);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   /* We ignore tail->drive.  The other option is to do nothing if tail
    * contains a drive letter.
    */

   al_ustr_assign(path->filename, tail->filename);

   for (i = 0; i < _al_vector_size(&tail->segments); i++) {
      al_append_path_component(path, get_segment_cstr(tail, i));
   }

   return true;
}